

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int default_emit_certificate_cb
              (ptls_emit_certificate_t *_self,ptls_t *tls,ptls_message_emitter_t *emitter,
              ptls_key_schedule_t *key_sched,ptls_iovec_t context,int push_status_request,
              uint16_t *compress_algos,size_t num_compress_algos)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long in_RCX;
  long *in_RDX;
  ptls_iovec_t pVar4;
  size_t body_size;
  size_t in_stack_00000050;
  size_t body_start;
  size_t capacity;
  undefined1 in_stack_00000068 [16];
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  int ret;
  size_t in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  ptls_buffer_t *in_stack_ffffffffffffff48;
  ptls_key_schedule_t *sched;
  size_t local_78;
  long local_68;
  int local_34;
  
  local_34 = (*(code *)in_RDX[3])(in_RDX);
  if (local_34 == 0) {
    plVar1 = (long *)*in_RDX;
    local_34 = ptls_buffer__do_pushv
                         (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
    if (local_34 == 0) {
      local_68 = 3;
      local_34 = ptls_buffer__do_pushv
                           (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff38);
      if (local_34 == 0) {
        lVar2 = plVar1[2];
        sched = (ptls_key_schedule_t *)*in_RDX;
        pVar4 = ptls_iovec_init((void *)0x0,0);
        local_78 = pVar4.len;
        local_34 = ptls_build_certificate_message
                             ((ptls_buffer_t *)capacity,(ptls_iovec_t)in_stack_00000068,
                              (ptls_iovec_t *)body_start,in_stack_00000050,__buf);
        if (local_34 == 0) {
          lVar3 = plVar1[2];
          for (; local_68 != 0; local_68 = local_68 + -1) {
            *(char *)(*plVar1 + (lVar2 - local_68)) =
                 (char)((ulong)(lVar3 - lVar2) >> (((char)local_68 + -1) * '\b' & 0x3fU));
          }
          if (in_RCX != 0) {
            ptls__key_schedule_update_hash(sched,(uint8_t *)in_stack_ffffffffffffff48,local_78);
          }
          local_34 = (*(code *)in_RDX[4])(in_RDX);
          if (local_34 == 0) {
            local_34 = 0;
          }
        }
      }
    }
  }
  return local_34;
}

Assistant:

static int default_emit_certificate_cb(ptls_emit_certificate_t *_self, ptls_t *tls, ptls_message_emitter_t *emitter,
                                       ptls_key_schedule_t *key_sched, ptls_iovec_t context, int push_status_request,
                                       const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    ptls_push_message(emitter, key_sched, PTLS_HANDSHAKE_TYPE_CERTIFICATE, {
        if ((ret = ptls_build_certificate_message(emitter->buf, context, tls->ctx->certificates.list, tls->ctx->certificates.count,
                                                  ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    });

    ret = 0;
Exit:
    return ret;
}